

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::AttachFile(cmCTestTestHandler *this,cmXMLWriter *xml,string *file,string *name)

{
  string *__return_storage_ptr__;
  ulong uVar1;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string measurement_name;
  string local_a0;
  undefined1 local_70 [8];
  string fname;
  string *base64;
  string *name_local;
  string *file_local;
  cmXMLWriter *xml_local;
  cmCTestTestHandler *this_local;
  
  __return_storage_ptr__ = (string *)((long)&fname.field_2 + 8);
  cmCTest::Base64GzipEncodeFile
            (__return_storage_ptr__,(this->super_cmCTestGenericHandler).CTest,file);
  cmsys::SystemTools::GetFilenameName((string *)local_70,file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"NamedMeasurement",
             (allocator<char> *)(measurement_name.field_2._M_local_buf + 0xf));
  cmXMLWriter::StartElement(xml,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(measurement_name.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::string((string *)local_c8,(string *)name);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_c8,"Attached File");
  }
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
  cmXMLWriter::Attribute<char[9]>(xml,"compression",(char (*) [9])"tar/gzip");
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"filename",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  cmXMLWriter::Attribute<char[5]>(xml,"type",(char (*) [5])0xe12e67);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Value",&local_e9);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_e8,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmCTestTestHandler::AttachFile(cmXMLWriter& xml, std::string const& file,
                                    std::string const& name)
{
  const std::string& base64 = this->CTest->Base64GzipEncodeFile(file);
  std::string const fname = cmSystemTools::GetFilenameName(file);
  xml.StartElement("NamedMeasurement");
  std::string measurement_name = name;
  if (measurement_name.empty()) {
    measurement_name = "Attached File";
  }
  xml.Attribute("name", measurement_name);
  xml.Attribute("encoding", "base64");
  xml.Attribute("compression", "tar/gzip");
  xml.Attribute("filename", fname);
  xml.Attribute("type", "file");
  xml.Element("Value", base64);
  xml.EndElement(); // NamedMeasurement
}